

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cc
# Opt level: O1

void __thiscall hmi::renderer::draw_rectangle(renderer *this,vec2f coords,vec2f size,color4f color)

{
  anon_union_8_5_712f1eca_for_vec<float,_2UL>_2 local_68;
  undefined8 local_60;
  undefined8 uStack_58;
  float local_50;
  float local_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 uStack_28;
  float local_20;
  float local_1c;
  anon_union_16_9_0ab46d14_for_vec<float,_4UL>_2 local_18;
  
  local_50 = coords.field_0._0_4_;
  local_1c = coords.field_0._4_4_;
  local_20 = size.field_0._0_4_ + local_50;
  local_4c = size.field_0._4_4_ + local_1c;
  local_38 = CONCAT44(local_4c,local_20);
  local_18._0_8_ = color.field_0._0_8_;
  local_18._8_8_ = color.field_0._8_8_;
  local_30 = local_18._0_8_;
  uStack_28 = local_18._8_8_;
  local_48 = local_18._0_8_;
  uStack_40 = local_18._8_8_;
  local_60 = local_18._0_8_;
  uStack_58 = local_18._8_8_;
  local_68 = coords.field_0;
  local_18 = color.field_0;
  draw(this,(vertex *)&local_68.x,4,2);
  return;
}

Assistant:

void renderer::draw_rectangle(vec2f coords, vec2f size, color4f color) {
    vertex vertices[4];

    vertices[0].position = { coords.x,              coords.y                };
    vertices[1].position = { coords.x,              coords.y + size.height  };
    vertices[2].position = { coords.x + size.width, coords.y + size.height  };
    vertices[3].position = { coords.x + size.width, coords.y                };

    vertices[0].color = vertices[1].color = vertices[2].color = vertices[3].color = color;

    draw(&vertices[0], 4, GL_LINE_LOOP);
  }